

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  byte bVar1;
  undefined2 uVar2;
  char cVar3;
  size_t sVar4;
  size_t sVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  undefined1 *puVar11;
  bool bVar12;
  BIT_DStream_t BStack_60;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar4 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar4;
  }
  if ((flags & 1U) != 0) {
    sVar4 = HUF_decompress1X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar4;
  }
  sVar4 = 0;
  if (0 < (long)maxDstSize) {
    sVar4 = maxDstSize;
  }
  uVar2 = *(undefined2 *)((long)DTable + 2);
  sVar5 = BIT_initDStream(&BStack_60,cSrc,cSrcSize);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  puVar11 = (undefined1 *)(sVar4 + (long)dst);
  cVar3 = (char)uVar2;
  if ((long)maxDstSize < 4) {
    if (BStack_60.bitsConsumed < 0x41) {
      if (BStack_60.ptr < BStack_60.limitPtr) {
        if (BStack_60.ptr == BStack_60.start) goto LAB_00f8316d;
        uVar8 = (int)BStack_60.ptr - (int)BStack_60.start;
        if (BStack_60.start <=
            (BitContainerType *)((long)BStack_60.ptr - (ulong)(BStack_60.bitsConsumed >> 3))) {
          uVar8 = BStack_60.bitsConsumed >> 3;
        }
        BStack_60.bitsConsumed = BStack_60.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = BStack_60.bitsConsumed >> 3;
        BStack_60.bitsConsumed = BStack_60.bitsConsumed & 7;
      }
      BStack_60.ptr = (char *)((long)BStack_60.ptr - (ulong)uVar8);
      BStack_60.bitContainer = *(BitContainerType *)BStack_60.ptr;
    }
    else {
      BStack_60.ptr = "";
    }
  }
  else {
    bVar6 = -cVar3 & 0x3f;
    while (BStack_60.bitsConsumed < 0x41) {
      if (BStack_60.ptr < BStack_60.limitPtr) {
        if (BStack_60.ptr == BStack_60.start) goto LAB_00f8316d;
        bVar12 = BStack_60.start <=
                 (BitContainerType *)((long)BStack_60.ptr - (ulong)(BStack_60.bitsConsumed >> 3));
        uVar8 = (int)BStack_60.ptr - (int)BStack_60.start;
        if (bVar12) {
          uVar8 = BStack_60.bitsConsumed >> 3;
        }
        BStack_60.bitsConsumed = BStack_60.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = BStack_60.bitsConsumed >> 3;
        BStack_60.bitsConsumed = BStack_60.bitsConsumed & 7;
        bVar12 = true;
      }
      BStack_60.ptr = (char *)((long)BStack_60.ptr - (ulong)uVar8);
      BStack_60.bitContainer = *(BitContainerType *)BStack_60.ptr;
      if ((puVar11 + -3 <= dst) || (!bVar12)) goto LAB_00f8316d;
      uVar7 = (BStack_60.bitContainer << ((byte)BStack_60.bitsConsumed & 0x3f)) >> bVar6;
      iVar9 = *(byte *)((long)DTable + uVar7 * 2 + 4) + BStack_60.bitsConsumed;
      uVar10 = (BStack_60.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      iVar9 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar9;
      uVar7 = (BStack_60.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar9 = (uint)*(byte *)((long)DTable + uVar7 * 2 + 4) + iVar9;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      uVar7 = (BStack_60.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
      bVar1 = *(byte *)((long)DTable + uVar7 * 2 + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      dst = (void *)((long)dst + 4);
      BStack_60.bitsConsumed = (uint)bVar1 + iVar9;
    }
    BStack_60.ptr = "";
  }
LAB_00f8316d:
  for (; dst < puVar11; dst = (void *)((long)dst + 1)) {
    uVar7 = (BStack_60.bitContainer << ((byte)BStack_60.bitsConsumed & 0x3f)) >> (-cVar3 & 0x3fU);
    BStack_60.bitsConsumed = *(byte *)((long)DTable + uVar7 * 2 + 4) + BStack_60.bitsConsumed;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
  }
  if (BStack_60.bitsConsumed != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (BStack_60.ptr != BStack_60.start) {
    maxDstSize = 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}